

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O3

void I210ToARGBRow_SSSE3(uint16_t *y_buf,uint16_t *u_buf,uint16_t *v_buf,uint8_t *dst_argb,
                        YuvConstants *yuvconstants,int width)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  bool bVar7;
  char cVar8;
  char cVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  short sVar56;
  ushort uVar57;
  undefined1 auVar58 [14];
  undefined1 auVar59 [12];
  unkbyte10 Var60;
  undefined1 auVar61 [14];
  undefined1 auVar62 [12];
  unkbyte10 Var63;
  undefined3 uVar64;
  unkbyte9 Var65;
  unkbyte9 Var66;
  uint uVar67;
  undefined1 auVar68 [11];
  undefined5 uVar69;
  unkbyte9 Var70;
  uint6 uVar71;
  undefined1 auVar72 [13];
  unkbyte9 Var73;
  undefined1 auVar74 [15];
  undefined6 uVar75;
  undefined4 uVar76;
  long lVar77;
  int iVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  int width_local;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar90 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined2 uVar93;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  
  auVar3 = *(undefined1 (*) [16])yuvconstants->kUVToB;
  auVar4 = *(undefined1 (*) [16])yuvconstants->kUVToG;
  auVar5 = *(undefined1 (*) [16])yuvconstants->kUVToR;
  sVar33 = yuvconstants->kUVBiasB[0];
  sVar34 = yuvconstants->kUVBiasB[1];
  sVar35 = yuvconstants->kUVBiasB[2];
  sVar36 = yuvconstants->kUVBiasB[3];
  sVar37 = yuvconstants->kUVBiasB[4];
  sVar38 = yuvconstants->kUVBiasB[5];
  sVar39 = yuvconstants->kUVBiasB[6];
  sVar40 = yuvconstants->kUVBiasB[7];
  sVar41 = yuvconstants->kUVBiasG[0];
  sVar42 = yuvconstants->kUVBiasG[1];
  sVar43 = yuvconstants->kUVBiasG[2];
  sVar44 = yuvconstants->kUVBiasG[3];
  sVar45 = yuvconstants->kUVBiasG[4];
  sVar46 = yuvconstants->kUVBiasG[5];
  sVar47 = yuvconstants->kUVBiasG[6];
  sVar48 = yuvconstants->kUVBiasG[7];
  sVar49 = yuvconstants->kUVBiasR[0];
  sVar50 = yuvconstants->kUVBiasR[1];
  sVar51 = yuvconstants->kUVBiasR[2];
  sVar52 = yuvconstants->kUVBiasR[3];
  sVar53 = yuvconstants->kUVBiasR[4];
  sVar54 = yuvconstants->kUVBiasR[5];
  sVar55 = yuvconstants->kUVBiasR[6];
  sVar56 = yuvconstants->kUVBiasR[7];
  auVar6 = *(undefined1 (*) [16])yuvconstants->kYToRgb;
  lVar77 = (long)v_buf - (long)u_buf;
  do {
    uVar1 = *(ulong *)u_buf;
    uVar2 = *(undefined8 *)((long)u_buf + lVar77);
    u_buf = (uint16_t *)((long)u_buf + 8);
    auVar79._8_4_ = 0;
    auVar79._0_8_ = uVar1;
    auVar79._12_2_ = (short)(uVar1 >> 0x30);
    auVar79._14_2_ = (short)((ulong)uVar2 >> 0x30);
    auVar104._12_4_ = auVar79._12_4_;
    auVar104._8_2_ = 0;
    auVar104._0_8_ = uVar1;
    auVar104._10_2_ = (short)((ulong)uVar2 >> 0x20);
    auVar103._10_6_ = auVar104._10_6_;
    auVar103._8_2_ = (short)(uVar1 >> 0x20);
    auVar103._0_8_ = uVar1;
    auVar80._8_8_ = auVar103._8_8_;
    auVar80._6_2_ = (short)((ulong)uVar2 >> 0x10);
    auVar80._4_2_ = (short)(uVar1 >> 0x10);
    auVar80._0_2_ = (undefined2)uVar1;
    auVar80._2_2_ = (short)uVar2;
    auVar80 = psraw(auVar80,2);
    sVar10 = auVar80._0_2_;
    sVar11 = auVar80._2_2_;
    auVar81._0_2_ =
         CONCAT11((0 < sVar11) * (sVar11 < 0x100) * auVar80[2] - (0xff < sVar11),
                  (0 < sVar10) * (sVar10 < 0x100) * auVar80[0] - (0xff < sVar10));
    sVar12 = auVar80._4_2_;
    sVar16 = auVar80._6_2_;
    auVar82._0_4_ =
         CONCAT13((0 < sVar16) * (sVar16 < 0x100) * auVar80[6] - (0xff < sVar16),
                  CONCAT12((0 < sVar12) * (sVar12 < 0x100) * auVar80[4] - (0xff < sVar12),
                           auVar81._0_2_));
    sVar20 = auVar80._8_2_;
    sVar24 = auVar80._10_2_;
    auVar83._0_6_ =
         CONCAT15((0 < sVar24) * (sVar24 < 0x100) * auVar80[10] - (0xff < sVar24),
                  CONCAT14((0 < sVar20) * (sVar20 < 0x100) * auVar80[8] - (0xff < sVar20),
                           auVar82._0_4_));
    sVar20 = auVar80._12_2_;
    sVar24 = auVar80._14_2_;
    auVar84._0_8_ =
         CONCAT17((0 < sVar24) * (sVar24 < 0x100) * auVar80[0xe] - (0xff < sVar24),
                  CONCAT16((0 < sVar20) * (sVar20 < 0x100) * auVar80[0xc] - (0xff < sVar20),
                           auVar83._0_6_));
    auVar85._0_10_ =
         CONCAT19((0 < sVar11) * (sVar11 < 0x100) * auVar80[2] - (0xff < sVar11),
                  CONCAT18((0 < sVar10) * (sVar10 < 0x100) * auVar80[0] - (0xff < sVar10),
                           auVar84._0_8_));
    auVar86[10] = (0 < sVar12) * (sVar12 < 0x100) * auVar80[4] - (0xff < sVar12);
    auVar86._0_10_ = auVar85._0_10_;
    auVar86[0xb] = (0 < sVar16) * (sVar16 < 0x100) * auVar80[6] - (0xff < sVar16);
    uVar93 = (undefined2)((ulong)auVar84._0_8_ >> 0x30);
    auVar86._12_2_ = uVar93;
    auVar86._14_2_ = uVar93;
    uVar93 = (undefined2)((uint6)auVar83._0_6_ >> 0x20);
    auVar85._12_4_ = auVar86._12_4_;
    auVar85._10_2_ = uVar93;
    auVar84._10_6_ = auVar85._10_6_;
    auVar84._8_2_ = uVar93;
    uVar93 = (undefined2)((uint)auVar82._0_4_ >> 0x10);
    auVar83._8_8_ = auVar84._8_8_;
    auVar83._6_2_ = uVar93;
    auVar82._6_10_ = auVar83._6_10_;
    auVar82._4_2_ = uVar93;
    auVar81._4_12_ = auVar82._4_12_;
    auVar81._2_2_ = auVar81._0_2_;
    auVar103 = psllw(*(undefined1 (*) [16])y_buf,6);
    y_buf = (uint16_t *)((long)y_buf + 0x10);
    auVar80 = pmaddubsw(auVar81,auVar3);
    auVar87._0_2_ = sVar33 - auVar80._0_2_;
    auVar87._2_2_ = sVar34 - auVar80._2_2_;
    auVar87._4_2_ = sVar35 - auVar80._4_2_;
    auVar87._6_2_ = sVar36 - auVar80._6_2_;
    auVar87._8_2_ = sVar37 - auVar80._8_2_;
    auVar87._10_2_ = sVar38 - auVar80._10_2_;
    auVar87._12_2_ = sVar39 - auVar80._12_2_;
    auVar87._14_2_ = sVar40 - auVar80._14_2_;
    auVar80 = pmaddubsw(auVar81,auVar4);
    auVar94._0_2_ = sVar41 - auVar80._0_2_;
    auVar94._2_2_ = sVar42 - auVar80._2_2_;
    auVar94._4_2_ = sVar43 - auVar80._4_2_;
    auVar94._6_2_ = sVar44 - auVar80._6_2_;
    auVar94._8_2_ = sVar45 - auVar80._8_2_;
    auVar94._10_2_ = sVar46 - auVar80._10_2_;
    auVar94._12_2_ = sVar47 - auVar80._12_2_;
    auVar94._14_2_ = sVar48 - auVar80._14_2_;
    auVar80 = pmaddubsw(auVar81,auVar5);
    auVar95._0_2_ = sVar49 - auVar80._0_2_;
    auVar95._2_2_ = sVar50 - auVar80._2_2_;
    auVar95._4_2_ = sVar51 - auVar80._4_2_;
    auVar95._6_2_ = sVar52 - auVar80._6_2_;
    auVar95._8_2_ = sVar53 - auVar80._8_2_;
    auVar95._10_2_ = sVar54 - auVar80._10_2_;
    auVar95._12_2_ = sVar55 - auVar80._12_2_;
    auVar95._14_2_ = sVar56 - auVar80._14_2_;
    auVar104 = pmulhuw(auVar103,auVar6);
    auVar80 = paddsw(auVar87,auVar104);
    auVar103 = paddsw(auVar94,auVar104);
    auVar104 = paddsw(auVar95,auVar104);
    auVar80 = psraw(auVar80,6);
    auVar103 = psraw(auVar103,6);
    auVar104 = psraw(auVar104,6);
    sVar10 = auVar80._0_2_;
    sVar16 = auVar80._2_2_;
    sVar13 = auVar80._4_2_;
    sVar17 = auVar80._6_2_;
    sVar21 = auVar80._8_2_;
    sVar25 = auVar80._10_2_;
    sVar28 = auVar80._12_2_;
    sVar11 = auVar80._14_2_;
    cVar8 = (0 < sVar11) * (sVar11 < 0x100) * auVar80[0xe] - (0xff < sVar11);
    sVar11 = auVar103._0_2_;
    sVar20 = auVar103._2_2_;
    sVar14 = auVar103._4_2_;
    sVar18 = auVar103._6_2_;
    sVar22 = auVar103._8_2_;
    sVar26 = auVar103._10_2_;
    sVar29 = auVar103._12_2_;
    sVar31 = auVar103._14_2_;
    sVar12 = auVar104._0_2_;
    sVar24 = auVar104._2_2_;
    sVar15 = auVar104._4_2_;
    sVar19 = auVar104._6_2_;
    sVar23 = auVar104._8_2_;
    sVar27 = auVar104._10_2_;
    sVar30 = auVar104._12_2_;
    sVar32 = auVar104._14_2_;
    cVar9 = (0 < sVar32) * (sVar32 < 0x100) * auVar104[0xe] - (0xff < sVar32);
    uVar57 = CONCAT11((0 < sVar12) * (sVar12 < 0x100) * auVar104[0] - (0xff < sVar12),cVar9);
    auVar99._0_9_ = (unkuint9)uVar57 << 0x38;
    uVar64 = CONCAT12((0 < sVar24) * (sVar24 < 0x100) * auVar104[2] - (0xff < sVar24),uVar57);
    uVar67 = CONCAT13((0 < sVar15) * (sVar15 < 0x100) * auVar104[4] - (0xff < sVar15),uVar64);
    auVar68._4_7_ = 0;
    auVar68._0_4_ = uVar67;
    auVar100._0_11_ = auVar68 << 0x38;
    uVar69 = CONCAT14((0 < sVar19) * (sVar19 < 0x100) * auVar104[6] - (0xff < sVar19),uVar67);
    uVar71 = CONCAT15((0 < sVar23) * (sVar23 < 0x100) * auVar104[8] - (0xff < sVar23),uVar69);
    auVar72._6_7_ = 0;
    auVar72._0_6_ = uVar71;
    auVar101._0_13_ = auVar72 << 0x38;
    auVar74[6] = (0 < sVar27) * (sVar27 < 0x100) * auVar104[10] - (0xff < sVar27);
    auVar74._0_6_ = uVar71;
    uVar93 = CONCAT11((0 < sVar31) * (sVar31 < 0x100) * auVar103[0xe] - (0xff < sVar31),cVar8);
    uVar76 = CONCAT31(CONCAT21(uVar93,(0 < sVar29) * (sVar29 < 0x100) * auVar103[0xc] -
                                      (0xff < sVar29)),
                      (0 < sVar28) * (sVar28 < 0x100) * auVar80[0xc] - (0xff < sVar28));
    uVar75 = CONCAT51(CONCAT41(uVar76,(0 < sVar26) * (sVar26 < 0x100) * auVar103[10] -
                                      (0xff < sVar26)),
                      (0 < sVar25) * (sVar25 < 0x100) * auVar80[10] - (0xff < sVar25));
    Var65 = CONCAT72(CONCAT61(uVar75,(0 < sVar22) * (sVar22 < 0x100) * auVar103[8] - (0xff < sVar22)
                             ),
                     CONCAT11((0 < sVar21) * (sVar21 < 0x100) * auVar80[8] - (0xff < sVar21),cVar8))
    ;
    Var60 = CONCAT91(CONCAT81((long)((unkuint9)Var65 >> 8),
                              (0 < sVar18) * (sVar18 < 0x100) * auVar103[6] - (0xff < sVar18)),
                     (0 < sVar17) * (sVar17 < 0x100) * auVar80[6] - (0xff < sVar17));
    auVar59._2_10_ = Var60;
    auVar59[1] = (0 < sVar14) * (sVar14 < 0x100) * auVar103[4] - (0xff < sVar14);
    auVar59[0] = (0 < sVar13) * (sVar13 < 0x100) * auVar80[4] - (0xff < sVar13);
    auVar58._2_12_ = auVar59;
    auVar58[1] = (0 < sVar20) * (sVar20 < 0x100) * auVar103[2] - (0xff < sVar20);
    auVar58[0] = (0 < sVar16) * (sVar16 < 0x100) * auVar80[2] - (0xff < sVar16);
    auVar88._0_2_ =
         CONCAT11((0 < sVar11) * (sVar11 < 0x100) * auVar103[0] - (0xff < sVar11),
                  (0 < sVar10) * (sVar10 < 0x100) * auVar80[0] - (0xff < sVar10));
    auVar88._2_14_ = auVar58;
    auVar74[7] = cVar9;
    auVar74._8_7_ = 0;
    auVar102._0_15_ = auVar74 << 0x38;
    auVar102[0xf] = 0xff;
    auVar101._14_2_ = auVar102._14_2_;
    auVar101[0xd] = 0xff;
    Var73 = CONCAT36(auVar101._13_3_,
                     CONCAT15((0 < sVar30) * (sVar30 < 0x100) * auVar104[0xc] - (0xff < sVar30),
                              uVar69));
    auVar100._12_4_ = (undefined4)((unkuint9)Var73 >> 0x28);
    auVar100[0xb] = 0xff;
    Var70 = CONCAT54(auVar100._11_5_,
                     CONCAT13((0 < sVar27) * (sVar27 < 0x100) * auVar104[10] - (0xff < sVar27),
                              uVar64));
    auVar99._10_6_ = (undefined6)((unkuint9)Var70 >> 0x18);
    auVar99[9] = 0xff;
    Var66 = CONCAT72(auVar99._9_7_,
                     CONCAT11((0 < sVar23) * (sVar23 < 0x100) * auVar104[8] - (0xff < sVar23),cVar9)
                    );
    auVar98._8_8_ = (undefined8)((unkuint9)Var66 >> 8);
    auVar98._0_8_ = 0xff00000000000000;
    Var63 = CONCAT91(auVar98._7_9_,(0 < sVar19) * (sVar19 < 0x100) * auVar104[6] - (0xff < sVar19));
    auVar97._6_10_ = Var63;
    auVar97._0_6_ = 0xff0000000000;
    auVar62._1_11_ = auVar97._5_11_;
    auVar62[0] = (0 < sVar15) * (sVar15 < 0x100) * auVar104[4] - (0xff < sVar15);
    auVar96._4_12_ = auVar62;
    auVar96._0_4_ = 0xff000000;
    auVar61._1_13_ = auVar96._3_13_;
    auVar61[0] = (0 < sVar24) * (sVar24 < 0x100) * auVar104[2] - (0xff < sVar24);
    auVar89[3] = 0xff;
    auVar89[2] = (0 < sVar12) * (sVar12 < 0x100) * auVar104[0] - (0xff < sVar12);
    auVar92._0_12_ = auVar88._0_12_;
    auVar92._12_2_ = (short)Var60;
    auVar92._14_2_ = (short)Var63;
    auVar91._12_4_ = auVar92._12_4_;
    auVar91._0_10_ = auVar88._0_10_;
    auVar91._10_2_ = auVar62._0_2_;
    auVar90._10_6_ = auVar91._10_6_;
    auVar90._0_8_ = auVar88._0_8_;
    auVar90._8_2_ = auVar59._0_2_;
    auVar89._8_8_ = auVar90._8_8_;
    auVar89._6_2_ = auVar61._0_2_;
    auVar89._4_2_ = auVar58._0_2_;
    auVar89._0_2_ = auVar88._0_2_;
    *(undefined1 (*) [16])dst_argb = auVar89;
    *(short *)*(undefined1 (*) [16])((long)dst_argb + 0x10) = (short)((unkuint9)Var65 >> 8);
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 2) = (short)((unkuint9)Var66 >> 8);
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 4) = (short)uVar75;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 6) = (short)((unkuint9)Var70 >> 0x18)
    ;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 8) = (short)uVar76;
    *(short *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 10) =
         (short)((unkuint9)Var73 >> 0x28);
    *(undefined2 *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 0xc) = uVar93;
    *(undefined2 *)(*(undefined1 (*) [16])((long)dst_argb + 0x10) + 0xe) = auVar101._14_2_;
    dst_argb = (uint8_t *)((long)dst_argb + 0x20);
    iVar78 = width + -8;
    bVar7 = 7 < width;
    width = iVar78;
  } while (iVar78 != 0 && bVar7);
  return;
}

Assistant:

void OMITFP I210ToARGBRow_SSSE3(const uint16_t* y_buf,
                                const uint16_t* u_buf,
                                const uint16_t* v_buf,
                                uint8_t* dst_argb,
                                const struct YuvConstants* yuvconstants,
                                int width) {
  asm volatile (
    YUVTORGB_SETUP(yuvconstants)
      "sub         %[u_buf],%[v_buf]             \n"
      "pcmpeqb     %%xmm5,%%xmm5                 \n"

    LABELALIGN
      "1:                                        \n"
    READYUV210
    YUVTORGB(yuvconstants)
    STOREARGB
      "sub         $0x8,%[width]                 \n"
      "jg          1b                            \n"
  : [y_buf]"+r"(y_buf),    // %[y_buf]
    [u_buf]"+r"(u_buf),    // %[u_buf]
    [v_buf]"+r"(v_buf),    // %[v_buf]
    [dst_argb]"+r"(dst_argb),  // %[dst_argb]
    [width]"+rm"(width)    // %[width]
  : [yuvconstants]"r"(yuvconstants)  // %[yuvconstants]
  : "memory", "cc", YUVTORGB_REGS
    "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5"
  );
}